

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

int ZSTD_dedicatedDictSearch_isSupported(ZSTD_compressionParameters *cParams)

{
  bool local_11;
  ZSTD_compressionParameters *cParams_local;
  
  local_11 = false;
  if (((ZSTD_dfast < cParams->strategy) && (local_11 = false, cParams->strategy < ZSTD_btlazy2)) &&
     (local_11 = false, cParams->chainLog < cParams->hashLog)) {
    local_11 = cParams->chainLog < 0x19;
  }
  return (int)local_11;
}

Assistant:

static int ZSTD_dedicatedDictSearch_isSupported(
        ZSTD_compressionParameters const* cParams)
{
    return (cParams->strategy >= ZSTD_greedy)
        && (cParams->strategy <= ZSTD_lazy2)
        && (cParams->hashLog > cParams->chainLog)
        && (cParams->chainLog <= 24);
}